

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_16bit_4chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  void *pvVar5;
  uint64_t *outall;
  uint8_t *puVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  int iVar12;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    pvVar5 = decode->unpacked_buffer;
    uVar2 = peVar4->width;
    puVar6 = peVar4[3].field_12.decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    lVar10 = (long)(int)uVar2;
    lVar7 = (long)(int)(uVar2 * 8);
    pvVar8 = (void *)((long)pvVar5 + lVar10 * 6);
    pvVar9 = (void *)((long)pvVar5 + lVar10 * 4);
    pvVar11 = (void *)((long)pvVar5 + lVar10 * 2);
    iVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar10 = 0;
        do {
          *(ulong *)(puVar6 + lVar10 * 4) =
               (ulong)*(ushort *)((long)pvVar9 + lVar10) << 0x10 |
               (ulong)*(ushort *)((long)pvVar11 + lVar10) << 0x20 |
               (ulong)*(ushort *)((long)pvVar5 + lVar10) << 0x30 |
               (ulong)*(ushort *)((long)pvVar8 + lVar10);
          lVar10 = lVar10 + 2;
        } while ((ulong)uVar2 * 2 != lVar10);
      }
      pvVar5 = (void *)((long)pvVar5 + lVar7);
      puVar6 = puVar6 + iVar3;
      iVar12 = iVar12 + 1;
      pvVar8 = (void *)((long)pvVar8 + lVar7);
      pvVar9 = (void *)((long)pvVar9 + lVar7);
      pvVar11 = (void *)((long)pvVar11 + lVar7);
    } while (iVar12 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;
    /* TODO: can do this with sse and do 2 outpixels at once */
    union
    {
        struct
        {
            uint16_t r;
            uint16_t g;
            uint16_t b;
            uint16_t a;
        };
        uint64_t allc;
    } combined;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[3].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint64_t* outall = (uint64_t*) out0;
        in0              = (const uint16_t*) srcbuffer;
        in1              = in0 + w;
        in2              = in1 + w;
        in3              = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            combined.a = one_to_native16 (in0[x]);
            combined.b = one_to_native16 (in1[x]);
            combined.g = one_to_native16 (in2[x]);
            combined.r = one_to_native16 (in3[x]);
            outall[x]  = combined.allc;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}